

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcp_echo_server.cpp
# Opt level: O2

void __thiscall
EchoServer::onMessage(EchoServer *this,KcpConnectionPtr *conn,string *message,Timestamp receiveTime)

{
  self *this_00;
  int in_R8D;
  SourceFile file;
  Logger local_1008;
  undefined1 local_38 [12];
  
  if ((this->m_mode == 1) && (sznet::g_logLevel < 3)) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_38,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/kcp_echo/kcp_echo_server.cpp"
              );
    receiveTime.m_microSecondsSinceEpoch = 0x46;
    file._12_4_ = 0;
    file.m_data = (char *)local_38._0_8_;
    file.m_size = local_38._8_4_;
    sznet::Logger::Logger(&local_1008,file,0x46);
    this_00 = sznet::LogStream::operator<<(&local_1008.m_impl.m_stream,"server recv: ");
    sznet::LogStream::operator<<(this_00,message);
    sznet::Logger::~Logger(&local_1008);
  }
  local_1008.m_impl.m_time.m_microSecondsSinceEpoch = (int64_t)(message->_M_dataplus)._M_p;
  local_1008.m_impl.m_stream._0_4_ = *(undefined4 *)&message->_M_string_length;
  sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::KcpConnection>_>::send
            (&this->m_codec,
             (int)(conn->super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr,&local_1008,receiveTime.m_microSecondsSinceEpoch,in_R8D);
  LOCK();
  (this->m_transferred).super___atomic_base<long>._M_i =
       (this->m_transferred).super___atomic_base<long>._M_i + message->_M_string_length;
  UNLOCK();
  LOCK();
  (this->m_receivedMessages).super___atomic_base<long>._M_i =
       (this->m_receivedMessages).super___atomic_base<long>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void onMessage(const sznet::net::KcpConnectionPtr& conn, const sznet::string& message, sznet::Timestamp receiveTime)
    {
        if (m_mode == 1)
        {
            LOG_INFO << "server recv: " << message;
        }
        m_codec.send(get_pointer(conn), message);
        size_t len = message.size();
        m_transferred.fetch_add(len);
        ++m_receivedMessages;
        (void)receiveTime;
    }